

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STAmount.cpp
# Opt level: O2

STAmount *
jbcoin::mulRound(STAmount *__return_storage_ptr__,STAmount *v1,STAmount *v2,Issue *issue,
                bool roundUp)

{
  bool bVar1;
  bool native;
  int64_t iVar2;
  int64_t iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  bool *pbVar7;
  int exponent;
  uint64_t uVar8;
  exponent_type eVar9;
  STAmount *amount;
  exponent_type eVar10;
  bool bVar11;
  bool bVar12;
  int local_84;
  uint64_t local_80;
  STAmount result;
  
  if ((v1->mValue == 0) || (v2->mValue == 0)) {
    uVar8 = 0;
    exponent = 0;
  }
  else {
    STAmount::STAmount(&result,issue,0,0,false);
    native = beast::operator==(&result.mIssue);
    if ((native & v2->mIsNative & v1->mIsNative) == 1) {
      iVar2 = getSNValue(v1);
      iVar3 = getSNValue(v2);
      amount = v2;
      if (iVar2 < iVar3) {
        amount = v1;
      }
      uVar4 = getSNValue(amount);
      iVar2 = getSNValue(v1);
      iVar3 = getSNValue(v2);
      if (iVar3 <= iVar2) {
        v2 = v1;
      }
      uVar5 = getSNValue(v2);
      if ((uVar4 < 0xb2d05e01) && ((uVar5 >> 0x20) * uVar4 < 0x7ce66c51)) {
        (__return_storage_ptr__->super_STBase).fName = (v1->super_STBase).fName;
        (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
        (__return_storage_ptr__->mIssue).currency.pn[0] = 0;
        (__return_storage_ptr__->mIssue).currency.pn[1] = 0;
        (__return_storage_ptr__->mIssue).currency.pn[2] = 0;
        (__return_storage_ptr__->mIssue).currency.pn[3] = 0;
        *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = 0;
        (__return_storage_ptr__->mIssue).account.pn[1] = 0;
        (__return_storage_ptr__->mIssue).account.pn[2] = 0;
        (__return_storage_ptr__->mIssue).account.pn[3] = 0;
        (__return_storage_ptr__->mIssue).account.pn[4] = 0;
        __return_storage_ptr__->mValue = uVar5 * uVar4;
        __return_storage_ptr__->mOffset = 0;
        __return_storage_ptr__->mIsNative = true;
        __return_storage_ptr__->mIsNegative = false;
        return __return_storage_ptr__;
      }
      Throw<std::runtime_error,char_const(&)[22]>((char (*) [22])"Native value overflow");
    }
    uVar4 = v1->mValue;
    uVar5 = v2->mValue;
    eVar10 = v1->mOffset;
    uVar6 = uVar4;
    if (uVar4 < 1000000000000000 && v1->mIsNative == true) {
      do {
        uVar4 = uVar6 * 10;
        eVar10 = eVar10 + -1;
        bVar12 = uVar6 < 100000000000000;
        uVar6 = uVar4;
      } while (bVar12);
    }
    eVar9 = v2->mOffset;
    uVar6 = uVar5;
    if (uVar5 < 1000000000000000 && (~v2->mIsNative & 1U) == 0) {
      do {
        uVar5 = uVar6 * 10;
        eVar9 = eVar9 + -1;
        bVar12 = uVar6 < 100000000000000;
        uVar6 = uVar5;
      } while (bVar12);
    }
    bVar12 = v1->mIsNegative;
    bVar1 = v2->mIsNegative;
    bVar11 = (bVar12 != bVar1) != roundUp;
    uVar8 = 0;
    if (bVar11) {
      uVar8 = 99999999999999;
    }
    local_80 = muldiv_round(uVar4,uVar5,100000000000000,uVar8);
    local_84 = eVar10 + eVar9 + 0xe;
    if (bVar11) {
      canonicalizeRound(native,&local_80,&local_84);
    }
    STAmount::STAmount(&result,issue,local_80,local_84,bVar12 != bVar1);
    if ((((bVar12 != bVar1) || (!roundUp)) ||
        (CONCAT26(result.mValue._6_2_,(undefined6)result.mValue) != 0)) ||
       (pbVar7 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover),
       *pbVar7 != true)) {
      (__return_storage_ptr__->super_STBase).fName = result.super_STBase.fName;
      (__return_storage_ptr__->super_STBase)._vptr_STBase = (_func_int **)&PTR__STBase_002f8010;
      *(undefined8 *)(__return_storage_ptr__->mIssue).currency.pn = result.mIssue.currency.pn._0_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 2) =
           result.mIssue.currency.pn._8_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).currency.pn + 4) = result.mIssue._16_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 1) =
           result.mIssue.account.pn._4_8_;
      *(undefined8 *)((__return_storage_ptr__->mIssue).account.pn + 3) =
           result.mIssue.account.pn._12_8_;
      __return_storage_ptr__->mValue = CONCAT26(result.mValue._6_2_,(undefined6)result.mValue);
      *(ulong *)((long)&__return_storage_ptr__->mValue + 6) =
           CONCAT62(result._64_6_,result.mValue._6_2_);
      return __return_storage_ptr__;
    }
    if ((native) &&
       (pbVar7 = LocalValue<bool>::operator*((LocalValue<bool> *)&stAmountCalcSwitchover2),
       *pbVar7 != false)) {
      exponent = 0;
      uVar8 = 1;
    }
    else {
      exponent = -0x60;
      uVar8 = 1000000000000000;
    }
  }
  STAmount::STAmount(__return_storage_ptr__,issue,uVar8,exponent,false);
  return __return_storage_ptr__;
}

Assistant:

STAmount
mulRound (STAmount const& v1, STAmount const& v2, Issue const& issue,
    bool roundUp)
{
    if (v1 == zero || v2 == zero)
        return {issue};

    bool const xrp = isXRP (issue);

    if (v1.native() && v2.native() && xrp)
    {
        std::uint64_t minV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v1) : getSNValue (v2);
        std::uint64_t maxV = (getSNValue (v1) < getSNValue (v2)) ?
                getSNValue (v2) : getSNValue (v1);

        if (minV > 3000000000ull) // sqrt(cMaxNative)
            Throw<std::runtime_error> ("Native value overflow");

        if (((maxV >> 32) * minV) > 2095475792ull) // cMaxNative / 2^32
            Throw<std::runtime_error> ("Native value overflow");

        return STAmount (v1.getFName (), minV * maxV);
    }

    std::uint64_t value1 = v1.mantissa(), value2 = v2.mantissa();
    int offset1 = v1.exponent(), offset2 = v2.exponent();

    if (v1.native())
    {
        while (value1 < STAmount::cMinValue)
        {
            value1 *= 10;
            --offset1;
        }
    }

    if (v2.native())
    {
        while (value2 < STAmount::cMinValue)
        {
            value2 *= 10;
            --offset2;
        }
    }

    bool const resultNegative = v1.negative() != v2.negative();

    // We multiply the two mantissas (each is between 10^15
    // and 10^16), so their product is in the 10^30 to 10^32
    // range. Dividing their product by 10^14 maintains the
    // precision, by scaling the result to 10^16 to 10^18.
    //
    // If the we're rounding up, we want to round up away
    // from zero, and if we're rounding down, truncation
    // is implicit.
    std::uint64_t amount = muldiv_round (
        value1, value2, tenTo14,
        (resultNegative != roundUp) ? tenTo14m1 : 0);

    int offset = offset1 + offset2 + 14;
    if (resultNegative != roundUp)
        canonicalizeRound (xrp, amount, offset);
    STAmount result (issue, amount, offset, resultNegative);

    // Control when bugfixes that require switchover dates are enabled
    if (roundUp && !resultNegative && !result && *stAmountCalcSwitchover)
    {
        if (xrp && *stAmountCalcSwitchover2)
        {
            // return the smallest value above zero
            amount = 1;
            offset = 0;
        }
        else
        {
            // return the smallest value above zero
            amount = STAmount::cMinValue;
            offset = STAmount::cMinOffset;
        }
        return STAmount(issue, amount, offset, resultNegative);
    }
    return result;
}